

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O0

void __thiscall
dynamicgraph::TimeDependency<int>::TimeDependency
          (TimeDependency<int> *this,SignalBase<int> *sig,SignalArray_const<int> *ar,
          DependencyType dep)

{
  DependencyType dep_local;
  SignalArray_const<int> *ar_local;
  SignalBase<int> *sig_local;
  TimeDependency<int> *this_local;
  
  this->_vptr_TimeDependency = (_func_int **)&PTR__TimeDependency_0017d828;
  this->leader = sig;
  (this->dependencies).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->dependencies).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->dependencies).
  super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ::list(&this->dependencies);
  this->updateFromAllChildren = false;
  this->dependencyType = dep;
  this->periodTime = 1;
  addDependencies(this,ar);
  return;
}

Assistant:

TimeDependency<Time>::TimeDependency(SignalBase<Time> *sig,
                                     const SignalArray_const<Time> &ar,
                                     const DependencyType dep)
    : __TIME_DEPENDENCY_INIT(sig, dep) {
  addDependencies(ar);

  return;
}